

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

int xmlStrcasecmp(xmlChar *str1,xmlChar *str2)

{
  byte *pbVar1;
  long lVar2;
  
  if (str1 != str2) {
    if (str1 == (xmlChar *)0x0) {
      return -1;
    }
    if (str2 == (xmlChar *)0x0) {
      return 1;
    }
    lVar2 = 0;
    do {
      pbVar1 = str2 + lVar2;
      if ((uint)""[str1[lVar2]] - (uint)""[*pbVar1] != 0) {
        return (uint)""[str1[lVar2]] - (uint)""[*pbVar1];
      }
      lVar2 = lVar2 + 1;
    } while (*pbVar1 != 0);
  }
  return 0;
}

Assistant:

int
xmlStrcasecmp(const xmlChar *str1, const xmlChar *str2) {
    register int tmp;

    if (str1 == str2) return(0);
    if (str1 == NULL) return(-1);
    if (str2 == NULL) return(1);
    do {
        tmp = casemap[*str1++] - casemap[*str2];
        if (tmp != 0) return(tmp);
    } while (*str2++ != 0);
    return 0;
}